

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void I210ToARGBRow_C(uint16_t *src_y,uint16_t *src_u,uint16_t *src_v,uint8_t *rgb_buf,
                    YuvConstants *yuvconstants,int width)

{
  char cVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  int iVar6;
  uint8_t uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  
  if (1 < width) {
    iVar6 = 0;
    do {
      uVar11 = (uint)((int)yuvconstants->kYToRgb[0] * (int)(short)*src_y) >> 10 & 0xffff;
      uVar8 = (uint)(int)(short)*src_u >> 2;
      if (0xfe < (int)(short)*src_u >> 2) {
        uVar8 = 0xff;
      }
      uVar12 = (uint)(int)(short)*src_v >> 2;
      if (0xfe < (int)(short)*src_v >> 2) {
        uVar12 = 0xff;
      }
      iVar10 = ((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uVar8 & 0xff)) +
               uVar11;
      if (iVar10 >> 6 < 1) {
        iVar10 = 0;
      }
      iVar10 = iVar10 >> 6;
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      cVar1 = yuvconstants->kUVToR[1];
      sVar4 = yuvconstants->kUVBiasR[0];
      iVar9 = ((int)yuvconstants->kUVBiasG[0] -
              ((int)yuvconstants->kUVToG[1] * (uVar12 & 0xff) +
              (int)yuvconstants->kUVToG[0] * (uVar8 & 0xff))) + uVar11;
      *rgb_buf = (uint8_t)iVar10;
      if (iVar9 >> 6 < 1) {
        iVar9 = 0;
      }
      iVar9 = iVar9 >> 6;
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      iVar10 = ((int)sVar4 - (int)cVar1 * (uVar12 & 0xff)) + uVar11;
      rgb_buf[1] = (uint8_t)iVar9;
      if (iVar10 >> 6 < 1) {
        iVar10 = 0;
      }
      iVar10 = iVar10 >> 6;
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      rgb_buf[2] = (uint8_t)iVar10;
      rgb_buf[3] = 0xff;
      cVar1 = yuvconstants->kUVToR[1];
      uVar11 = (uint)((int)yuvconstants->kYToRgb[0] * (int)(short)src_y[1]) >> 10 & 0xffff;
      uVar8 = (uint)(int)(short)*src_u >> 2;
      if (0xfe < (int)(short)*src_u >> 2) {
        uVar8 = 0xff;
      }
      uVar12 = (uint)(int)(short)*src_v >> 2;
      if (0xfe < (int)(short)*src_v >> 2) {
        uVar12 = 0xff;
      }
      sVar4 = yuvconstants->kUVBiasR[0];
      iVar10 = ((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uVar8 & 0xff)) +
               uVar11;
      if (iVar10 >> 6 < 1) {
        iVar10 = 0;
      }
      iVar10 = iVar10 >> 6;
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      iVar9 = ((int)yuvconstants->kUVBiasG[0] -
              ((int)yuvconstants->kUVToG[1] * (uVar12 & 0xff) +
              (int)yuvconstants->kUVToG[0] * (uVar8 & 0xff))) + uVar11;
      rgb_buf[4] = (uint8_t)iVar10;
      if (iVar9 >> 6 < 1) {
        iVar9 = 0;
      }
      iVar9 = iVar9 >> 6;
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      iVar10 = ((int)sVar4 - (int)cVar1 * (uVar12 & 0xff)) + uVar11;
      rgb_buf[5] = (uint8_t)iVar9;
      if (iVar10 >> 6 < 1) {
        iVar10 = 0;
      }
      iVar10 = iVar10 >> 6;
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      rgb_buf[6] = (uint8_t)iVar10;
      rgb_buf[7] = 0xff;
      src_y = src_y + 2;
      src_u = src_u + 1;
      src_v = src_v + 1;
      rgb_buf = rgb_buf + 8;
      iVar6 = iVar6 + 2;
    } while (iVar6 < width + -1);
  }
  if ((width & 1U) != 0) {
    cVar1 = yuvconstants->kUVToG[0];
    cVar2 = yuvconstants->kUVToG[1];
    cVar3 = yuvconstants->kUVToR[1];
    sVar4 = yuvconstants->kUVBiasG[0];
    sVar5 = yuvconstants->kUVBiasR[0];
    uVar11 = (uint)((int)yuvconstants->kYToRgb[0] * (int)(short)*src_y) >> 10 & 0xffff;
    uVar8 = (uint)(int)(short)*src_u >> 2;
    if (0xfe < (int)(short)*src_u >> 2) {
      uVar8 = 0xff;
    }
    uVar12 = (uint)(int)(short)*src_v >> 2;
    if (0xfe < (int)(short)*src_v >> 2) {
      uVar12 = 0xff;
    }
    iVar6 = (int)(((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uVar8 & 0xff)) +
                 uVar11) >> 6;
    iVar10 = 0;
    if (iVar6 < 1) {
      iVar6 = iVar10;
    }
    uVar7 = (uint8_t)iVar6;
    if (0xfe < iVar6) {
      uVar7 = 0xff;
    }
    *rgb_buf = uVar7;
    iVar6 = (int)(((int)sVar4 - ((int)cVar2 * (uVar12 & 0xff) + (uVar8 & 0xff) * (int)cVar1)) +
                 uVar11) >> 6;
    if (iVar6 < 1) {
      iVar6 = iVar10;
    }
    uVar7 = (uint8_t)iVar6;
    if (0xfe < iVar6) {
      uVar7 = 0xff;
    }
    rgb_buf[1] = uVar7;
    iVar6 = (int)(((int)sVar5 - (uVar12 & 0xff) * (int)cVar3) + uVar11) >> 6;
    if (iVar6 < 1) {
      iVar6 = iVar10;
    }
    uVar7 = (uint8_t)iVar6;
    if (0xfe < iVar6) {
      uVar7 = 0xff;
    }
    rgb_buf[2] = uVar7;
    rgb_buf[3] = 0xff;
  }
  return;
}

Assistant:

void I210ToARGBRow_C(const uint16_t* src_y,
                     const uint16_t* src_u,
                     const uint16_t* src_v,
                     uint8_t* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel10(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
               rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
    YuvPixel10(src_y[1], src_u[0], src_v[0], rgb_buf + 4, rgb_buf + 5,
               rgb_buf + 6, yuvconstants);
    rgb_buf[7] = 255;
    src_y += 2;
    src_u += 1;
    src_v += 1;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel10(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
               rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
  }
}